

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::MergeReturnPass::CreatePhiNodesForInst
          (MergeReturnPass *this,BasicBlock *merge_block,Instruction *inst)

{
  MergeReturnPass *this_00;
  DominatorAnalysis *pDVar1;
  pointer ppIVar2;
  bool bVar3;
  uint32_t uVar4;
  BasicBlock *pBVar5;
  DefUseManager *pDVar6;
  mapped_type *this_01;
  CFG *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  size_type sVar7;
  Instruction *pIVar8;
  FeatureManager *pFVar9;
  pointer ppIVar10;
  pointer puVar11;
  BasicBlock *merge_block_local;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_c0;
  MergeReturnPass *local_b8;
  uint32_t pred_id;
  undefined4 uStack_ac;
  uint32_t local_a8;
  undefined4 uStack_a4;
  InsertionPointTy local_a0;
  code *local_98;
  DominatorAnalysis *dom_tree;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  users_to_update;
  uint32_t undef_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> phi_operands;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preds;
  
  merge_block_local = merge_block;
  dom_tree = IRContext::GetDominatorAnalysis
                       ((this->super_MemPass).super_Pass.context_,merge_block->function_);
  uVar4 = Instruction::result_id(inst);
  if (uVar4 == 0) {
    return;
  }
  pBVar5 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,inst);
  users_to_update.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  users_to_update.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  users_to_update.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar6 = IRContext::get_def_use_mgr((this->super_MemPass).super_Pass.context_);
  _local_a8 = 0;
  _pred_id = operator_new(0x28);
  (((Instruction *)_pred_id)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  _vptr_IntrusiveNodeBase = (_func_int **)&users_to_update;
  (((Instruction *)_pred_id)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
       (Instruction *)&dom_tree;
  (((Instruction *)_pred_id)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
       inst;
  *(BasicBlock **)
   &(((Instruction *)_pred_id)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ =
       pBVar5;
  ((Instruction *)_pred_id)->context_ = (IRContext *)this;
  local_98 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:281:9)>
             ::_M_invoke;
  local_a0.super_iterator.node_ =
       (iterator)
       std::
       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:281:9)>
       ::_M_manager;
  analysis::DefUseManager::ForEachUser
            (pDVar6,inst,(function<void_(spvtools::opt::Instruction_*)> *)&pred_id);
  if (local_a0.super_iterator.node_ != (Instruction *)0x0) {
    (*(code *)local_a0.super_iterator.node_)(&pred_id,&pred_id,3);
  }
  if (users_to_update.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      users_to_update.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00221395;
  uVar4 = Instruction::type_id(inst);
  undef_id = MemPass::Type2Undef(&this->super_MemPass,uVar4);
  phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = std::__detail::
            _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->new_edges_,&merge_block_local);
  local_b8 = this;
  this_02 = Pass::cfg((Pass *)this);
  uVar4 = BasicBlock::id(merge_block_local);
  __x = CFG::preds(this_02,uVar4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&preds,__x);
  for (puVar11 = preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 = local_b8,
      puVar11 !=
      preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
    pred_id = *puVar11;
    sVar7 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      (this_01,&pred_id);
    if (sVar7 == 0) {
      uVar4 = Instruction::result_id(inst);
      local_c0._M_head_impl._0_4_ = uVar4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&phi_operands,(uint *)&local_c0);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&phi_operands,&undef_id);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&phi_operands,&pred_id);
  }
  pDVar6 = Pass::get_def_use_mgr((Pass *)local_b8);
  uVar4 = Instruction::type_id(inst);
  pIVar8 = analysis::DefUseManager::GetDef(pDVar6,uVar4);
  if (pIVar8->opcode_ == OpTypePointer) {
    pFVar9 = IRContext::get_feature_mgr((this_00->super_MemPass).super_Pass.context_);
    bVar3 = EnumSet<spv::Capability>::contains(&pFVar9->capabilities_,VariablePointers);
    uVar4 = Instruction::GetSingleWordInOperand(pIVar8,0);
    if ((bVar3) && ((uVar4 & 0xfffffff7) == 4)) goto LAB_002212bf;
    pIVar8 = Instruction::Clone(inst,(this_00->super_MemPass).super_Pass.context_);
    local_c0._M_head_impl = pIVar8;
    uVar4 = Pass::TakeNextId((Pass *)this_00);
    Instruction::SetResultId(pIVar8,uVar4);
    pIVar8 = (merge_block_local->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    while (pIVar8->opcode_ == OpPhi) {
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar8 = (Instruction *)0x0;
      }
    }
    pIVar8 = Instruction::InsertBefore
                       (pIVar8,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_c0);
    pDVar6 = Pass::get_def_use_mgr((Pass *)this_00);
    analysis::DefUseManager::AnalyzeInstDefUse(pDVar6,pIVar8);
    IRContext::set_instr_block
              ((this_00->super_MemPass).super_Pass.context_,pIVar8,merge_block_local);
    pDVar1 = dom_tree;
    pBVar5 = merge_block_local;
    _local_a8 = 0;
    _pred_id = operator_new(0x18);
    (((Instruction *)_pred_id)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    _vptr_IntrusiveNodeBase = (_func_int **)pDVar1;
    (((Instruction *)_pred_id)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
         (Instruction *)pBVar5;
    (((Instruction *)_pred_id)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_
         = (Instruction *)local_b8;
    local_98 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:358:28)>
               ::_M_invoke;
    local_a0.super_iterator.node_ =
         (iterator)
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:358:28)>
         ::_M_manager;
    Instruction::ForEachInId(pIVar8,(function<void_(unsigned_int_*)> *)&pred_id);
    if (local_a0.super_iterator.node_ != (Instruction *)0x0) {
      (*(code *)local_a0.super_iterator.node_)(&pred_id,&pred_id,3);
    }
    if (local_c0._M_head_impl != (Instruction *)0x0) {
      (*((local_c0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  else {
LAB_002212bf:
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)&pred_id,(this_00->super_MemPass).super_Pass.context_,
               (merge_block_local->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
               .super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_,
               kAnalysisInstrToBlockMapping|kAnalysisBegin);
    uVar4 = Instruction::type_id(inst);
    pIVar8 = InstructionBuilder::AddPhi((InstructionBuilder *)&pred_id,uVar4,&phi_operands,0);
  }
  uVar4 = Instruction::result_id(pIVar8);
  ppIVar2 = users_to_update.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar10 = users_to_update.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppIVar10 != ppIVar2;
      ppIVar10 = ppIVar10 + 1) {
    pIVar8 = *ppIVar10;
    uStack_a4 = 0;
    local_a8 = uVar4;
    local_98 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:375:25)>
               ::_M_invoke;
    local_a0.super_iterator.node_ =
         (iterator)
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:375:25)>
         ::_M_manager;
    _pred_id = inst;
    Instruction::ForEachInId(pIVar8,(function<void_(unsigned_int_*)> *)&pred_id);
    if (local_a0.super_iterator.node_ != (Instruction *)0x0) {
      (*(code *)local_a0.super_iterator.node_)
                ((function<void_(unsigned_int_*)> *)&pred_id,
                 (function<void_(unsigned_int_*)> *)&pred_id,3);
    }
    IRContext::AnalyzeUses((local_b8->super_MemPass).super_Pass.context_,pIVar8);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
LAB_00221395:
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&users_to_update.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return;
}

Assistant:

void MergeReturnPass::CreatePhiNodesForInst(BasicBlock* merge_block,
                                            Instruction& inst) {
  DominatorAnalysis* dom_tree =
      context()->GetDominatorAnalysis(merge_block->GetParent());

  if (inst.result_id() != 0) {
    BasicBlock* inst_bb = context()->get_instr_block(&inst);
    std::vector<Instruction*> users_to_update;
    context()->get_def_use_mgr()->ForEachUser(
        &inst,
        [&users_to_update, &dom_tree, &inst, inst_bb, this](Instruction* user) {
          BasicBlock* user_bb = nullptr;
          if (user->opcode() != spv::Op::OpPhi) {
            user_bb = context()->get_instr_block(user);
          } else {
            // For OpPhi, the use should be considered to be in the predecessor.
            for (uint32_t i = 0; i < user->NumInOperands(); i += 2) {
              if (user->GetSingleWordInOperand(i) == inst.result_id()) {
                uint32_t user_bb_id = user->GetSingleWordInOperand(i + 1);
                user_bb = context()->get_instr_block(user_bb_id);
                break;
              }
            }
          }

          // If |user_bb| is nullptr, then |user| is not in the function.  It is
          // something like an OpName or decoration, which should not be
          // replaced with the result of the OpPhi.
          if (user_bb && !dom_tree->Dominates(inst_bb, user_bb)) {
            users_to_update.push_back(user);
          }
        });

    if (users_to_update.empty()) {
      return;
    }

    // There is at least one values that needs to be replaced.
    // First create the OpPhi instruction.
    uint32_t undef_id = Type2Undef(inst.type_id());
    std::vector<uint32_t> phi_operands;
    const std::set<uint32_t>& new_edges = new_edges_[merge_block];

    // Add the OpPhi operands. If the predecessor is a return block use undef,
    // otherwise use |inst|'s id.
    std::vector<uint32_t> preds = cfg()->preds(merge_block->id());
    for (uint32_t pred_id : preds) {
      if (new_edges.count(pred_id)) {
        phi_operands.push_back(undef_id);
      } else {
        phi_operands.push_back(inst.result_id());
      }
      phi_operands.push_back(pred_id);
    }

    Instruction* new_phi = nullptr;
    // If the instruction is a pointer and variable pointers are not an option,
    // then we have to regenerate the instruction instead of creating an OpPhi
    // instruction.  If not, the Spir-V will be invalid.
    Instruction* inst_type = get_def_use_mgr()->GetDef(inst.type_id());
    bool regenerateInstruction = false;
    if (inst_type->opcode() == spv::Op::OpTypePointer) {
      if (!context()->get_feature_mgr()->HasCapability(
              spv::Capability::VariablePointers)) {
        regenerateInstruction = true;
      }

      auto storage_class =
          spv::StorageClass(inst_type->GetSingleWordInOperand(0));
      if (storage_class != spv::StorageClass::Workgroup &&
          storage_class != spv::StorageClass::StorageBuffer) {
        regenerateInstruction = true;
      }
    }

    if (regenerateInstruction) {
      std::unique_ptr<Instruction> regen_inst(inst.Clone(context()));
      uint32_t new_id = TakeNextId();
      regen_inst->SetResultId(new_id);
      Instruction* insert_pos = &*merge_block->begin();
      while (insert_pos->opcode() == spv::Op::OpPhi) {
        insert_pos = insert_pos->NextNode();
      }
      new_phi = insert_pos->InsertBefore(std::move(regen_inst));
      get_def_use_mgr()->AnalyzeInstDefUse(new_phi);
      context()->set_instr_block(new_phi, merge_block);

      new_phi->ForEachInId([dom_tree, merge_block, this](uint32_t* use_id) {
        Instruction* use = get_def_use_mgr()->GetDef(*use_id);
        BasicBlock* use_bb = context()->get_instr_block(use);
        if (use_bb != nullptr && !dom_tree->Dominates(use_bb, merge_block)) {
          CreatePhiNodesForInst(merge_block, *use);
        }
      });
    } else {
      InstructionBuilder builder(
          context(), &*merge_block->begin(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
      new_phi = builder.AddPhi(inst.type_id(), phi_operands);
    }
    uint32_t result_of_phi = new_phi->result_id();

    // Update all of the users to use the result of the new OpPhi.
    for (Instruction* user : users_to_update) {
      user->ForEachInId([&inst, result_of_phi](uint32_t* id) {
        if (*id == inst.result_id()) {
          *id = result_of_phi;
        }
      });
      context()->AnalyzeUses(user);
    }
  }
}